

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf-decoder.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::read_from_file_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *filename)

{
  streambuf_type *__s;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  allocator<char> local_251;
  undefined1 local_250 [2] [12];
  undefined1 local_230 [12];
  undefined1 local_220 [8];
  ifstream file;
  char *filename_local;
  
  std::ifstream::ifstream(local_220,(char *)this,_S_bin);
  __s = (streambuf_type *)std::ifstream::rdbuf();
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_230,__s);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_250);
  std::allocator<char>::allocator();
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_250[0]._0_8_;
  __end._M_c = local_250[0]._8_4_;
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_230._0_8_;
  __beg._M_c = local_230._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_251);
  std::allocator<char>::~allocator(&local_251);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string read_from_file(const char* filename) {
    const std::ifstream file{filename, std::ios::binary};
    return std::string{std::istreambuf_iterator<char>(file.rdbuf()),
                       std::istreambuf_iterator<char>()};
}